

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O2

void __thiscall ggml_backend_registry::ggml_backend_registry(ggml_backend_registry *this)

{
  ggml_backend_reg_t reg;
  __uniq_ptr_impl<void,_dl_handle_deleter> local_18;
  
  (this->devices).super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->devices).super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->backends).
  super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->devices).super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->backends).
  super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->backends).
  super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reg = (ggml_backend_reg_t)ggml_backend_cpu_reg();
  local_18._M_t.super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl =
       (tuple<void_*,_dl_handle_deleter>)(_Tuple_impl<0UL,_void_*,_dl_handle_deleter>)0x0;
  register_backend(this,reg,(dl_handle_ptr *)&local_18);
  std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr
            ((unique_ptr<void,_dl_handle_deleter> *)&local_18);
  return;
}

Assistant:

ggml_backend_registry() {
#ifdef GGML_USE_CUDA
        register_backend(ggml_backend_cuda_reg());
#endif
#ifdef GGML_USE_METAL
        register_backend(ggml_backend_metal_reg());
#endif
#ifdef GGML_USE_SYCL
        register_backend(ggml_backend_sycl_reg());
#endif
#ifdef GGML_USE_VULKAN
        register_backend(ggml_backend_vk_reg());
#endif
#ifdef GGML_USE_OPENCL
        register_backend(ggml_backend_opencl_reg());
#endif
#ifdef GGML_USE_CANN
        register_backend(ggml_backend_cann_reg());
#endif
#ifdef GGML_USE_BLAS
        register_backend(ggml_backend_blas_reg());
#endif
#ifdef GGML_USE_RPC
        register_backend(ggml_backend_rpc_reg());
#endif
#ifdef GGML_USE_KOMPUTE
        register_backend(ggml_backend_kompute_reg());
#endif
#ifdef GGML_USE_CPU
        register_backend(ggml_backend_cpu_reg());
#endif
    }